

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)

{
  int iVar1;
  DUMB_IT_SIGDATA *pDVar2;
  IT_ENTRY *pIVar3;
  bool bVar4;
  DUMB_IT_SIGDATA **ppDVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  DUMB_IT_SIGRENDERER *in_RDI;
  longlong t_1;
  longlong t;
  IT_ENTRY *entry_1;
  int ignore_cxx;
  IT_ENTRY *entry;
  int processorder;
  int n_1;
  IT_PATTERN *pattern;
  IT_CHANNEL *channel;
  int n;
  DUMB_IT_SIGDATA *sigdata;
  int in_stack_0000009c;
  IT_ENTRY *in_stack_000000a0;
  DUMB_IT_SIGRENDERER *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar9;
  byte bVar10;
  long local_60;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffb0;
  DUMB_IT_SIGRENDERER *local_40;
  int local_34;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffd0;
  int local_1c;
  
  pDVar2 = in_RDI->sigdata;
  if ((in_RDI->speed == 0) || (iVar6 = in_RDI->tick + -1, in_RDI->tick = iVar6, iVar6 != 0)) {
    if (((pDVar2->flags & 0x1000U) != 0) && ((in_RDI->tick & 0xfU) != 0)) goto LAB_00857724;
LAB_0085770e:
    update_effects(in_stack_ffffffffffffffd0);
    update_tick_counts(in_stack_ffffffffffffff90);
  }
  else {
    reset_tick_counts(in_RDI);
    in_RDI->tick = in_RDI->speed;
    in_RDI->rowcount = in_RDI->rowcount + -1;
    if (in_RDI->rowcount != 0) {
      in_stack_ffffffffffffffb0 = (DUMB_IT_SIGRENDERER *)in_RDI->entry;
      while( true ) {
        bVar4 = false;
        if (in_stack_ffffffffffffffb0 < (DUMB_IT_SIGRENDERER *)in_RDI->entry_end) {
          bVar4 = *(byte *)&in_stack_ffffffffffffffb0->sigdata < 0x40;
        }
        if (!bVar4) break;
        if ((((ulong)in_stack_ffffffffffffffb0->sigdata & 0x800) != 0) &&
           (*(uchar *)((long)&in_stack_ffffffffffffffb0->sigdata + 5) != '\x0f')) {
          process_effects(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c);
        }
        in_stack_ffffffffffffffb0 =
             (DUMB_IT_SIGRENDERER *)((long)&in_stack_ffffffffffffffb0->sigdata + 7);
      }
      update_effects(in_stack_ffffffffffffffd0);
      goto LAB_00857724;
    }
    in_RDI->rowcount = 1;
    if (in_RDI->n_rows != 0) {
      bit_array_set(in_RDI->played,(long)(in_RDI->order * 0x100 + in_RDI->row));
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        lVar8 = (long)local_1c;
        if (in_RDI->channel[lVar8].played_patjump != (void *)0x0) {
          if (in_RDI->channel[lVar8].played_patjump_order == in_RDI->order) {
            bit_array_set(in_RDI->channel[lVar8].played_patjump,(long)in_RDI->row);
          }
          else {
            bit_array_destroy((void *)0x856ef3);
            in_RDI->channel[lVar8].played_patjump = (void *)0x0;
            in_RDI->channel[lVar8].played_patjump_order = 0xfffe;
          }
        }
      }
    }
    in_RDI->processrow = in_RDI->processrow + 1;
    if (in_RDI->processrow < in_RDI->n_rows) {
      if (in_RDI->entry == (IT_ENTRY *)0x0) {
        bit_array_clear(in_RDI->played,(long)(in_RDI->order << 8));
        in_RDI->entry = in_RDI->entry_start;
        in_RDI->row = 0;
      }
      else {
        while (in_RDI->entry < in_RDI->entry_end) {
          if (0x3f < in_RDI->entry->channel) {
            in_RDI->entry = in_RDI->entry + 1;
            break;
          }
          in_RDI->entry = in_RDI->entry + 1;
        }
        in_RDI->row = in_RDI->row + 1;
      }
    }
    else {
      iVar6 = in_RDI->processorder;
      if ((in_RDI->processrow | 0xc00U) == 0xffff) {
        in_RDI->processrow = in_RDI->breakrow;
        in_RDI->breakrow = 0;
        for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
          in_RDI->channel[local_34].pat_loop_end_row = '\0';
        }
      }
      else {
        in_RDI->processrow = in_RDI->breakrow;
        in_RDI->breakrow = 0;
      }
      if (in_RDI->processorder == 0xffff) {
        in_RDI->processorder = in_RDI->order + -1;
      }
LAB_0085702e:
      while (in_RDI->processorder = in_RDI->processorder + 1,
            pDVar2->n_orders <= in_RDI->processorder) {
        in_RDI->processorder = in_RDI->restart_position;
        if (in_RDI->processorder < pDVar2->n_orders) {
          if ((pDVar2->flags & 0x800U) != 0) {
            in_RDI->speed = pDVar2->speed;
            in_RDI->tempo = pDVar2->tempo;
            for (local_34 = 0; local_34 < 0x40; local_34 = local_34 + 1) {
              xm_note_off((DUMB_IT_SIGDATA *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (IT_CHANNEL *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            }
          }
          break;
        }
        in_RDI->processorder = -1;
      }
      uVar7 = (uint)pDVar2->order[in_RDI->processorder];
      if (pDVar2->n_patterns <= (int)uVar7) {
        if (uVar7 != 0xfe) {
          in_RDI->processorder = in_RDI->restart_position + -1;
        }
        for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
          bit_array_set(in_RDI->played,(long)(in_RDI->processorder * 0x100 + local_34));
        }
        goto LAB_0085702e;
      }
      in_stack_ffffffffffffffd0 = (DUMB_IT_SIGRENDERER *)(pDVar2->pattern + (int)uVar7);
      iVar1 = in_RDI->n_rows;
      in_RDI->n_rows = *(int *)&in_stack_ffffffffffffffd0->sigdata;
      if (in_RDI->n_rows <= in_RDI->processrow) {
        in_RDI->processrow = 0;
      }
      pIVar3 = *(IT_ENTRY **)&in_stack_ffffffffffffffd0->n_channels;
      in_RDI->entry_start = pIVar3;
      in_RDI->entry = pIVar3;
      in_RDI->entry_end = in_RDI->entry + *(int *)((long)&in_stack_ffffffffffffffd0->sigdata + 4);
      if (iVar1 != 0) {
        if (iVar6 == 0xffff) {
          if (in_RDI->processorder < in_RDI->order) {
LAB_008572a7:
            iVar6 = bit_array_test(in_RDI->played,
                                   (long)(in_RDI->processorder * 0x100 + in_RDI->processrow));
            if ((iVar6 != 0) && (in_RDI->callbacks->loop != (_func_int_void_ptr *)0x0)) {
              iVar6 = (*in_RDI->callbacks->loop)(in_RDI->callbacks->loop_data);
              if (iVar6 != 0) {
                return 1;
              }
              bit_array_reset((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
              ;
              if (in_RDI->speed == 0) goto LAB_0085770e;
            }
          }
        }
        else if (in_RDI->processorder <= in_RDI->order) goto LAB_008572a7;
      }
      in_RDI->order = in_RDI->processorder;
      for (local_34 = in_RDI->processrow; local_34 != 0; local_34 = local_34 + -1) {
        while (in_RDI->entry < in_RDI->entry_end) {
          if (0x3f < in_RDI->entry->channel) {
            in_RDI->entry = in_RDI->entry + 1;
            break;
          }
          in_RDI->entry = in_RDI->entry + 1;
        }
      }
      in_RDI->row = in_RDI->processrow;
    }
    if ((pDVar2->flags & 0x400U) == 0) {
      reset_effects((DUMB_IT_SIGRENDERER *)
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    local_40 = (DUMB_IT_SIGRENDERER *)in_RDI->entry;
    while( true ) {
      bVar10 = 0;
      if (local_40 < in_RDI->entry_end) {
        bVar10 = 0x3f < *(byte *)&local_40->sigdata ^ 0xff;
      }
      if ((bVar10 & 1) == 0) break;
      local_40 = (DUMB_IT_SIGRENDERER *)((long)local_40 + 7);
      update_pattern_variables
                ((DUMB_IT_SIGRENDERER *)
                 CONCAT17(bVar10,CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
                 (IT_ENTRY *)in_stack_ffffffffffffff90);
    }
    local_40 = (DUMB_IT_SIGRENDERER *)in_RDI->entry;
    while( true ) {
      bVar9 = 0;
      if (local_40 < (DUMB_IT_SIGRENDERER *)in_RDI->entry_end) {
        bVar9 = 0x3f < *(byte *)&local_40->sigdata ^ 0xff;
      }
      if ((bVar9 & 1) == 0) break;
      ppDVar5 = &local_40->sigdata;
      iVar6 = process_entry((DUMB_IT_SIGRENDERER *)
                            CONCAT17(bVar10,CONCAT16(bVar9,in_stack_ffffffffffffff98)),
                            (IT_ENTRY *)local_40,(int)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffff90 = local_40;
      local_40 = (DUMB_IT_SIGRENDERER *)((long)ppDVar5 + 7);
      if (iVar6 != 0) {
        return 1;
      }
    }
    if ((pDVar2->flags & 0x800U) == 0) {
      if ((pDVar2->flags & 0x10U) == 0) {
        update_smooth_effects(in_stack_ffffffffffffff90);
      }
    }
    else {
      update_effects(in_stack_ffffffffffffffd0);
    }
  }
LAB_00857724:
  if (in_RDI->globalvolume == '\0') {
    if (in_RDI->callbacks->global_volume_zero != (_func_int_void_ptr *)0x0) {
      uVar7 = in_RDI->gvz_sub_time + (int)(0x2800000 / (long)(in_RDI->tempo << 8)) * 0x10000;
      in_RDI->gvz_time = (int)(short)(uVar7 >> 0x10) + in_RDI->gvz_time;
      in_RDI->gvz_sub_time = uVar7 & 0xffff;
      if ((0xbffff < in_RDI->gvz_time) &&
         (iVar6 = (*in_RDI->callbacks->global_volume_zero)
                            (in_RDI->callbacks->global_volume_zero_data), iVar6 != 0)) {
        return 1;
      }
    }
  }
  else if (in_RDI->callbacks->global_volume_zero != (_func_int_void_ptr *)0x0) {
    in_RDI->gvz_time = 0;
    in_RDI->gvz_sub_time = 0;
  }
  process_all_playing(in_stack_ffffffffffffffb0);
  local_60 = (long)((int)(0x2800000 / (long)(in_RDI->tempo << 8)) << 0x10);
  if ((in_RDI->sigdata->flags & 0x1000U) != 0) {
    local_60 = local_60 / 0x10;
  }
  local_60 = in_RDI->sub_time_left + local_60;
  in_RDI->time_left = (int)((ulong)local_60 >> 0x10) + in_RDI->time_left;
  in_RDI->sub_time_left = (uint)local_60 & 0xffff;
  return 0;
}

Assistant:

static int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)
{
	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;

	// Set note vol/freq to vol/freq set for each channel

	if (sigrenderer->speed && --sigrenderer->tick == 0) {
		reset_tick_counts(sigrenderer);
		sigrenderer->tick = sigrenderer->speed;
		sigrenderer->rowcount--;
		if (sigrenderer->rowcount == 0) {
			sigrenderer->rowcount = 1;

#ifdef BIT_ARRAY_BULLSHIT
			if (sigrenderer->n_rows)
			{
#if 1
				/*
				if (bit_array_test(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row))
				{
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
						bit_array_reset(sigrenderer->played);
						if (sigrenderer->speed == 0)
							goto speed0; // I love goto
					}
				}
				*/
#endif
				bit_array_set(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row);
				{
					int n;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++)
					{
						IT_CHANNEL * channel = &sigrenderer->channel[n];
						if (channel->played_patjump)
						{
							if (channel->played_patjump_order == sigrenderer->order)
							{
								bit_array_set(channel->played_patjump, sigrenderer->row);
							}
							/*
							else if ((channel->played_patjump_order & 0x7FFF) == sigrenderer->order)
							{
								channel->played_patjump_order |= 0x4000;
							}
							else if ((channel->played_patjump_order & 0x3FFF) == sigrenderer->order)
							{
								if ((sigdata->flags & (IT_WAS_AN_XM|IT_WAS_A_MOD)) == IT_WAS_AN_XM)
								{
									// joy, was XM, pattern loop bug triggered break to row in same order 
									bit_array_mask(sigrenderer->played, channel->played_patjump, sigrenderer->order * 256);
								}
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
							*/
							else
							{
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
						}
					}
				}
			}
#endif

			sigrenderer->processrow++;

			if (sigrenderer->processrow >= sigrenderer->n_rows) {
				IT_PATTERN *pattern;
				int n;
				int processorder = sigrenderer->processorder;

				if ((sigrenderer->processrow|0xC00) == 0xFFFE + 1) { /* It was incremented above! */
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++) sigrenderer->channel[n].pat_loop_end_row = 0;
				} else {
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0; // XXX lolwut
				}

				if (sigrenderer->processorder == 0xFFFF)
					sigrenderer->processorder = sigrenderer->order - 1;

				for (;;) {
					sigrenderer->processorder++;

					if (sigrenderer->processorder >= sigdata->n_orders) {
						sigrenderer->processorder = sigrenderer->restart_position;
						if (sigrenderer->processorder >= sigdata->n_orders) {
							/* Restarting beyond end. We'll loop for now. */
							sigrenderer->processorder = -1;
							continue;
						}
						if (sigdata->flags & IT_WAS_AN_OKT) {
							/* Reset some things */
							sigrenderer->speed = sigdata->speed;
							sigrenderer->tempo = sigdata->tempo;
							for (n = 0; n < DUMB_IT_N_CHANNELS; n++) {
								xm_note_off(sigdata, &sigrenderer->channel[n]);
							}
						}
					}

					n = sigdata->order[sigrenderer->processorder];

					if (n < sigdata->n_patterns)
						break;

#ifdef INVALID_ORDERS_END_SONG
					if (n != IT_ORDER_SKIP)
#else
					if (n == IT_ORDER_END)
#endif
					{
						sigrenderer->processorder = sigrenderer->restart_position - 1;
					}

#ifdef BIT_ARRAY_BULLSHIT
					/* Fix play tracking and timekeeping for orders containing skip commands */
					for (n = 0; n < 256; n++) {
						bit_array_set(sigrenderer->played, sigrenderer->processorder * 256 + n);
					}
#endif
				}

				pattern = &sigdata->pattern[n];

				n = sigrenderer->n_rows;
				sigrenderer->n_rows = pattern->n_rows;

				if (sigrenderer->processrow >= sigrenderer->n_rows)
					sigrenderer->processrow = 0;

/** WARNING - everything pertaining to a new pattern initialised? */

				sigrenderer->entry = sigrenderer->entry_start = pattern->entry;
				sigrenderer->entry_end = sigrenderer->entry + pattern->n_entries;

				/* If n_rows was 0, we're only just starting. Don't do anything weird here. */
				/* added: process row check, for break to row spooniness */
				if (n && (processorder == 0xFFFF ? sigrenderer->order > sigrenderer->processorder : sigrenderer->order >= sigrenderer->processorder)
#ifdef BIT_ARRAY_BULLSHIT
					&& bit_array_test(sigrenderer->played, sigrenderer->processorder * 256 + sigrenderer->processrow)
#endif
					) {
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
#ifdef BIT_ARRAY_BULLSHIT
						bit_array_reset(sigrenderer->played);
#endif
						if (sigrenderer->speed == 0)
							goto speed0; /* I love goto */
					}
				}
				sigrenderer->order = sigrenderer->processorder;

				n = sigrenderer->processrow;
				while (n) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					n--;
				}
				sigrenderer->row = sigrenderer->processrow;
			} else {
				if (sigrenderer->entry) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					sigrenderer->row++;
				} else {
#ifdef BIT_ARRAY_BULLSHIT
					bit_array_clear(sigrenderer->played, sigrenderer->order * 256);
#endif
					sigrenderer->entry = sigrenderer->entry_start;
					sigrenderer->row = 0;
				}
			}

			if (!(sigdata->flags & IT_WAS_A_669))
				reset_effects(sigrenderer);

			{
				IT_ENTRY *entry = sigrenderer->entry;
				int ignore_cxx = 0;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					ignore_cxx |= update_pattern_variables(sigrenderer, entry++);

				entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					if (process_entry(sigrenderer, entry++, sigdata->flags & IT_WAS_AN_XM ? 0 : ignore_cxx))
						return 1;
			}

			if (sigdata->flags & IT_WAS_AN_OKT)
				update_effects(sigrenderer);
			else if (!(sigdata->flags & IT_OLD_EFFECTS))
				update_smooth_effects(sigrenderer);
		} else {
			{
				IT_ENTRY *entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry)) {
					if (entry->mask & IT_ENTRY_EFFECT && entry->effect != IT_SET_SAMPLE_OFFSET)
						process_effects(sigrenderer, entry, 0);
							/* Don't bother checking the return value; if there
							 * was a pattern delay, there can't be a speed=0.
							 */
					entry++;
				}
			}

			update_effects(sigrenderer);
		}
	} else {
		if ( !(sigdata->flags & IT_WAS_AN_STM) || !(sigrenderer->tick & 15)) {
			speed0:
			update_effects(sigrenderer);
			update_tick_counts(sigrenderer);
		}
	}

	if (sigrenderer->globalvolume == 0) {
		if (sigrenderer->callbacks->global_volume_zero) {
			LONG_LONG t = sigrenderer->gvz_sub_time + ((TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16);
			sigrenderer->gvz_time += (int)(t >> 16);
			sigrenderer->gvz_sub_time = (int)t & 65535;
			if (sigrenderer->gvz_time >= 65536 * 12) {
				if ((*sigrenderer->callbacks->global_volume_zero)(sigrenderer->callbacks->global_volume_zero_data))
					return 1;
			}
		}
	} else {
		if (sigrenderer->callbacks->global_volume_zero) {
			sigrenderer->gvz_time = 0;
			sigrenderer->gvz_sub_time = 0;
		}
	}

	process_all_playing(sigrenderer);

	{
		LONG_LONG t = (TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16;
		if ( sigrenderer->sigdata->flags & IT_WAS_AN_STM ) {
			t /= 16;
		}
		t += sigrenderer->sub_time_left;
		sigrenderer->time_left += (int)(t >> 16);
		sigrenderer->sub_time_left = (int)t & 65535;
	}

	return 0;
}